

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdpeer.cc
# Opt level: O0

int __thiscall bdSpace::scanOutOfDatePeers(bdSpace *this,list<bdId,_std::allocator<bdId>_> *peerIds)

{
  uint32_t uVar1;
  time_t tVar2;
  time_t tVar3;
  bool bVar4;
  pointer pbVar5;
  pointer pbVar6;
  size_type sVar7;
  const_iterator local_b8;
  _List_node_base *local_b0;
  byte local_a5;
  bool discard;
  byte local_91;
  iterator iStack_90;
  bool added;
  _List_node_base *local_88;
  __normal_iterator<bdBucket_*,_std::vector<bdBucket,_std::allocator<bdBucket>_>_> local_80;
  bdBucket *local_78;
  time_t local_70;
  time_t ts;
  iterator eit;
  iterator it;
  iterator mit;
  map<bdMetric,_bdId,_std::less<bdMetric>,_std::allocator<std::pair<const_bdMetric,_bdId>_>_>
  closest;
  uint32_t attachedCount;
  bool doAttached;
  list<bdId,_std::allocator<bdId>_> *peerIds_local;
  bdSpace *this_local;
  
  uVar1 = this->mAttachedCount;
  closest._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 0;
  std::map<bdMetric,_bdId,_std::less<bdMetric>,_std::allocator<std::pair<const_bdMetric,_bdId>_>_>::
  map((map<bdMetric,_bdId,_std::less<bdMetric>,_std::allocator<std::pair<const_bdMetric,_bdId>_>_> *
      )&mit);
  std::_Rb_tree_iterator<std::pair<const_bdMetric,_bdId>_>::_Rb_tree_iterator
            ((_Rb_tree_iterator<std::pair<const_bdMetric,_bdId>_> *)&it);
  __gnu_cxx::__normal_iterator<bdBucket_*,_std::vector<bdBucket,_std::allocator<bdBucket>_>_>::
  __normal_iterator((__normal_iterator<bdBucket_*,_std::vector<bdBucket,_std::allocator<bdBucket>_>_>
                     *)&eit);
  std::_List_iterator<bdPeer>::_List_iterator((_List_iterator<bdPeer> *)&ts);
  local_70 = time((time_t *)0x0);
  local_78 = (bdBucket *)std::vector<bdBucket,_std::allocator<bdBucket>_>::begin(&this->buckets);
  eit._M_node = (_List_node_base *)local_78;
  while( true ) {
    local_80._M_current =
         (bdBucket *)std::vector<bdBucket,_std::allocator<bdBucket>_>::end(&this->buckets);
    bVar4 = __gnu_cxx::operator!=
                      ((__normal_iterator<bdBucket_*,_std::vector<bdBucket,_std::allocator<bdBucket>_>_>
                        *)&eit,&local_80);
    if (!bVar4) break;
    pbVar5 = __gnu_cxx::
             __normal_iterator<bdBucket_*,_std::vector<bdBucket,_std::allocator<bdBucket>_>_>::
             operator->((__normal_iterator<bdBucket_*,_std::vector<bdBucket,_std::allocator<bdBucket>_>_>
                         *)&eit);
    local_88 = (_List_node_base *)
               std::__cxx11::list<bdPeer,_std::allocator<bdPeer>_>::begin(&pbVar5->entries);
    ts = (time_t)local_88;
    while( true ) {
      pbVar5 = __gnu_cxx::
               __normal_iterator<bdBucket_*,_std::vector<bdBucket,_std::allocator<bdBucket>_>_>::
               operator->((__normal_iterator<bdBucket_*,_std::vector<bdBucket,_std::allocator<bdBucket>_>_>
                           *)&eit);
      iStack_90 = std::__cxx11::list<bdPeer,_std::allocator<bdPeer>_>::end(&pbVar5->entries);
      bVar4 = std::operator!=((_Self *)&ts,&stack0xffffffffffffff70);
      if (!bVar4) break;
      local_91 = 0;
      if ((uVar1 != 0) &&
         (pbVar6 = std::_List_iterator<bdPeer>::operator->((_List_iterator<bdPeer> *)&ts),
         tVar2 = local_70, (pbVar6->mExtraFlags & 2) != 0)) {
        pbVar6 = std::_List_iterator<bdPeer>::operator->((_List_iterator<bdPeer> *)&ts);
        tVar3 = local_70;
        if ((0x11 < tVar2 - pbVar6->mLastSendTime) &&
           (pbVar6 = std::_List_iterator<bdPeer>::operator->((_List_iterator<bdPeer> *)&ts),
           0x11 < tVar3 - pbVar6->mLastRecvTime)) {
          pbVar6 = std::_List_iterator<bdPeer>::operator->((_List_iterator<bdPeer> *)&ts);
          std::__cxx11::list<bdId,_std::allocator<bdId>_>::push_back(peerIds,&pbVar6->mPeerId);
          tVar2 = local_70;
          pbVar6 = std::_List_iterator<bdPeer>::operator->((_List_iterator<bdPeer> *)&ts);
          pbVar6->mLastSendTime = tVar2;
          local_91 = 1;
        }
        closest._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ =
             (uint32_t)closest._M_t._M_impl.super__Rb_tree_header._M_node_count + 1;
      }
      tVar2 = local_70;
      if ((((local_91 & 1) == 0) &&
          (pbVar6 = std::_List_iterator<bdPeer>::operator->((_List_iterator<bdPeer> *)&ts),
          tVar3 = local_70, 300 < tVar2 - pbVar6->mLastSendTime)) &&
         ((pbVar6 = std::_List_iterator<bdPeer>::operator->((_List_iterator<bdPeer> *)&ts),
          300 < tVar3 - pbVar6->mLastRecvTime ||
          (pbVar6 = std::_List_iterator<bdPeer>::operator->((_List_iterator<bdPeer> *)&ts),
          (pbVar6->mPeerFlags & 2) == 0)))) {
        pbVar6 = std::_List_iterator<bdPeer>::operator->((_List_iterator<bdPeer> *)&ts);
        std::__cxx11::list<bdId,_std::allocator<bdId>_>::push_back(peerIds,&pbVar6->mPeerId);
        tVar2 = local_70;
        pbVar6 = std::_List_iterator<bdPeer>::operator->((_List_iterator<bdPeer> *)&ts);
        pbVar6->mLastSendTime = tVar2;
      }
      tVar2 = local_70;
      local_a5 = 0;
      pbVar6 = std::_List_iterator<bdPeer>::operator->((_List_iterator<bdPeer> *)&ts);
      tVar3 = local_70;
      if (0x267 < tVar2 - pbVar6->mLastRecvTime) {
        local_a5 = 1;
      }
      pbVar6 = std::_List_iterator<bdPeer>::operator->((_List_iterator<bdPeer> *)&ts);
      if ((0xf < tVar3 - pbVar6->mFoundTime) &&
         (pbVar6 = std::_List_iterator<bdPeer>::operator->((_List_iterator<bdPeer> *)&ts),
         (pbVar6->mPeerFlags & 2) == 0)) {
        local_a5 = 1;
      }
      if ((local_a5 & 1) == 0) {
        std::_List_iterator<bdPeer>::operator++((_List_iterator<bdPeer> *)&ts,0);
      }
      else {
        pbVar5 = __gnu_cxx::
                 __normal_iterator<bdBucket_*,_std::vector<bdBucket,_std::allocator<bdBucket>_>_>::
                 operator->((__normal_iterator<bdBucket_*,_std::vector<bdBucket,_std::allocator<bdBucket>_>_>
                             *)&eit);
        std::_List_const_iterator<bdPeer>::_List_const_iterator(&local_b8,(iterator *)&ts);
        local_b0 = (_List_node_base *)
                   std::__cxx11::list<bdPeer,_std::allocator<bdPeer>_>::erase
                             (&pbVar5->entries,local_b8);
        ts = (time_t)local_b0;
      }
    }
    __gnu_cxx::__normal_iterator<bdBucket_*,_std::vector<bdBucket,_std::allocator<bdBucket>_>_>::
    operator++((__normal_iterator<bdBucket_*,_std::vector<bdBucket,_std::allocator<bdBucket>_>_> *)
               &eit,0);
  }
  if ((600 < local_70 - this->mAttachTS) ||
     ((uint32_t)closest._M_t._M_impl.super__Rb_tree_header._M_node_count != this->mAttachedCount)) {
    updateAttachedPeers(this);
    this->mAttachTS = local_70;
  }
  sVar7 = std::__cxx11::list<bdId,_std::allocator<bdId>_>::size(peerIds);
  std::map<bdMetric,_bdId,_std::less<bdMetric>,_std::allocator<std::pair<const_bdMetric,_bdId>_>_>::
  ~map((map<bdMetric,_bdId,_std::less<bdMetric>,_std::allocator<std::pair<const_bdMetric,_bdId>_>_>
        *)&mit);
  return (int)sVar7;
}

Assistant:

int	bdSpace::scanOutOfDatePeers(std::list<bdId> &peerIds) {
	/* 
	 * 
	 */
	bool doAttached = (mAttachedCount > 0);
	uint32_t attachedCount = 0;

	std::map<bdMetric, bdId> closest;
	std::map<bdMetric, bdId>::iterator mit;

	std::vector<bdBucket>::iterator it;
	std::list<bdPeer>::iterator eit;
	time_t ts = time(NULL);

	/* iterate through the buckets, and sort by distance */
	for (it = buckets.begin(); it != buckets.end(); it++) {
		for (eit = it->entries.begin(); eit != it->entries.end(); )
		{
			bool added = false;
			if (doAttached) {
				if (eit->mExtraFlags & BITDHT_PEER_EXFLAG_ATTACHED) {
					/* add to send list, if we haven't pinged recently */
					if ((ts - eit->mLastSendTime > BITDHT_ATTACHED_SEND_PERIOD ) &&
						(ts - eit->mLastRecvTime > BITDHT_ATTACHED_SEND_PERIOD )) {
						peerIds.push_back(eit->mPeerId);
						eit->mLastSendTime = ts;
						added = true;
					}
					attachedCount++;
				}
			}
				

			/* timeout on last send time! */
			if ((!added) && (ts - eit->mLastSendTime > BITDHT_MAX_SEND_PERIOD )) {
				/* We want to ping a peer iff:
		 	 	 * 1) They are out-of-date: mLastRecvTime is too old.
			 	 * 2) They don't have 0x0001 flag (we haven't received a PONG) and never sent.
			 	 */
				if ((ts - eit->mLastRecvTime > BITDHT_MAX_SEND_PERIOD ) || 
					!(eit->mPeerFlags & BITDHT_PEER_STATUS_RECV_PONG)) {
					peerIds.push_back(eit->mPeerId);
					eit->mLastSendTime = ts;
				}
			}


			/* we also want to remove very old entries (should it happen here?) 
			 * which are not pushed out by newer entries (will happen in for closer buckets)
			 */

			bool discard = false;
			/* discard very old entries */
			if (ts - eit->mLastRecvTime > BITDHT_DISCARD_PERIOD) {
				discard = true;
			}
		
			/* discard peers which have not responded to anything (ie have no flags set) */
			/* changed into have not id'ed themselves, as we've added ping to list of flags. */
			if ((ts - eit->mFoundTime > BITDHT_MAX_RESPONSE_PERIOD ) &&
				!(eit->mPeerFlags & BITDHT_PEER_STATUS_RECV_PONG)) {
				discard = true;
			}
			

			/* INCREMENT */
			if (discard) {
				eit = it->entries.erase(eit);
			}
			else
			{
				eit++;
			}
		}
	}

#define ATTACH_UPDATE_PERIOD	600

	if ((ts - mAttachTS > ATTACH_UPDATE_PERIOD) || (attachedCount != mAttachedCount)) {
		//std::cerr << "Updating ATTACH Stuff";
		//std::cerr << std::endl;
		updateAttachedPeers(); /* XXX TEMP HACK to look at stability */
		mAttachTS = ts;
	}

	return (peerIds.size());
}